

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_struct_field_sync_write
          (t_rs_generator *this,string *field_var,bool field_var_is_ref,t_field *tfield,e_req req)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  t_type *this_00;
  int iVar4;
  t_type *ptVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined7 in_register_00000011;
  t_rs_generator *this_01;
  char *__s;
  string let_var;
  string field_ident_string;
  ostringstream field_stream;
  string local_218;
  string local_1f8;
  undefined4 local_1d4;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1d4 = (undefined4)CONCAT71(in_register_00000011,field_var_is_ref);
  this_00 = tfield->type_;
  local_1b0 = field_var;
  ptVar5 = t_type::get_true_type(this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"TFieldIdentifier::new(",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(tfield->name_)._M_dataplus._M_p,
                      (tfield->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
  this_01 = (t_rs_generator *)0x3a9b9f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  to_rust_field_type_enum_abi_cxx11_(&local_1d0,this_01,this_00);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,tfield->key_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  if (req - T_OPTIONAL < 2) {
    iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[5])(ptVar5);
    if ((char)iVar4 == '\0') {
      __s = "ref fld_var";
    }
    else {
      iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[6])(ptVar5);
      __s = "fld_var";
      if ((char)iVar4 != '\0') {
        __s = "ref fld_var";
      }
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,__s,__s + sVar7);
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar1 = &this->f_gen_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if let Some(",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(local_1b0->_M_dataplus)._M_p,local_1b0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    paVar3 = &local_218.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"o_prot.write_field_begin(&",0x1a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")?;",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    local_218._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"fld_var","");
    render_type_sync_write(this,&local_218,true,this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"o_prot.write_field_end()?",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_00339e87;
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1f8,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_gen_,local_1f8._M_dataplus._M_p,
                        local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"o_prot.write_field_begin(&",0x1a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")?;",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    render_type_sync_write(this,local_1b0,local_1d4._0_1_,tfield->type_);
    t_generator::indent_abi_cxx11_(&local_1f8,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_gen_,local_1f8._M_dataplus._M_p,
                        local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"o_prot.write_field_end()?;",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_00339e87;
  }
  operator_delete(local_1f8._M_dataplus._M_p);
LAB_00339e87:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void t_rs_generator::render_struct_field_sync_write(
  const string &field_var,
  bool field_var_is_ref,
  t_field *tfield,
  t_field::e_req req
) {
  t_type* field_type = tfield->get_type();
  t_type* actual_type = get_true_type(field_type);

  ostringstream field_stream;
  field_stream
    << "TFieldIdentifier::new("
    << "\"" << tfield->get_name() << "\"" << ", " // note: use *original* name
    << to_rust_field_type_enum(field_type) << ", "
    << tfield->get_key() << ")";
  string field_ident_string = field_stream.str();

  if (is_optional(req)) {
    string let_var((actual_type->is_base_type() && !actual_type->is_string()) ? "fld_var" : "ref fld_var");
    f_gen_ << indent() << "if let Some(" << let_var << ") = " << field_var << " {" << endl;
    indent_up();
    f_gen_ << indent() << "o_prot.write_field_begin(&" << field_ident_string << ")?;" << endl;
    render_type_sync_write("fld_var", true, field_type);
    f_gen_ << indent() << "o_prot.write_field_end()?" << endl;
    indent_down();
    /* FIXME: rethink how I deal with OPT_IN_REQ_OUT
    if (req == t_field::T_OPT_IN_REQ_OUT) {
      f_gen_ << indent() << "let field_ident = " << field_ident_string << ";" << endl;
      f_gen_ << indent() << "o_prot.write_field_begin(&field_ident)?;" << endl;
      f_gen_ << indent() << "o_prot.write_field_end()?;" << endl;
    }*/
    f_gen_ << indent() << "}" << endl;
  } else {
    f_gen_ << indent() << "o_prot.write_field_begin(&" << field_ident_string << ")?;" << endl;
    render_type_sync_write(field_var, field_var_is_ref, tfield->get_type());
    f_gen_ << indent() << "o_prot.write_field_end()?;" << endl;
  }
}